

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O3

Accel * __thiscall embree::BVH4Factory::BVH4UserGeometryMB(BVH4Factory *this,Scene *scene)

{
  BVHN<4> *this_00;
  Builder *pBVar1;
  Accel *pAVar2;
  Intersectors intersectors;
  Intersector16 local_160;
  BVHN<4> *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  Intersector1 IStack_128;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  char *local_f8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  char *local_68;
  
  this_00 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&Object::type,scene);
  local_130 = 0;
  IStack_128.intersect = (IntersectFunc)0x0;
  local_140 = 0;
  uStack_138 = 0;
  IStack_128.occluded = (OccludedFunc)0x0;
  memset(&IStack_128.name,0,0xe0);
  local_148 = this_00;
  (*this->BVH4VirtualMBIntersector1)(&IStack_128);
  (*this->BVH4VirtualMBIntersector4Chunk)((Intersector4 *)&local_160);
  local_f8 = local_160.name;
  local_108 = local_160.intersect._0_4_;
  uStack_104 = local_160.intersect._4_4_;
  uStack_100 = local_160.occluded._0_4_;
  uStack_fc = local_160.occluded._4_4_;
  (*this->BVH4VirtualMBIntersector8Chunk)((Intersector8 *)&local_160);
  local_b0 = local_160.name;
  local_c0 = local_160.intersect._0_4_;
  uStack_bc = local_160.intersect._4_4_;
  uStack_b8 = local_160.occluded._0_4_;
  uStack_b4 = local_160.occluded._4_4_;
  (*this->BVH4VirtualMBIntersector16Chunk)(&local_160);
  local_68 = local_160.name;
  pBVar1 = (*this->BVH4VirtualMBSceneBuilderSAH)(this_00,scene,0);
  pAVar2 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar2->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar2->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_0218aba8;
  memcpy(&(pAVar2->super_AccelData).field_0x58,&local_148,0x118);
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_0218ab40;
  pAVar2[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  pAVar2[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar1;
  return pAVar2;
}

Assistant:

Accel* BVH4Factory::BVH4UserGeometryMB(Scene* scene)
  {
    BVH4* accel = new BVH4(Object::type,scene);
    Accel::Intersectors intersectors = BVH4UserGeometryMBIntersectors(accel);
    Builder* builder = BVH4VirtualMBSceneBuilderSAH(accel,scene,0);
    return new AccelInstance(accel,builder,intersectors);
  }